

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transpose.h
# Opt level: O1

void Eigen::internal::
     inplace_transpose_selector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_false,_false>::run
               (Matrix<double,__1,__1,_0,__1,__1> *m)

{
  ActualDstType actualDst;
  swap_assign_op<double> local_29;
  Matrix<double,__1,__1,_1,__1,__1> local_28;
  Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_10;
  
  local_10.m_matrix = m;
  if ((m->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows ==
      (m->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols) {
    local_28.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data =
         (double *)m;
    Assignment<Eigen::TriangularView<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_10U>,_Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::swap_assign_op<double>,_Eigen::internal::Dense2Triangular,_void>
    ::run((TriangularView<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_10U> *)&local_28,&local_10,
          &local_29);
  }
  else {
    local_28.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data =
         (double *)0x0;
    local_28.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows = 0;
    local_28.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols = 0;
    call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::internal::assign_op<double,double>>
              (&local_28,&local_10,(assign_op<double,_double> *)&local_29);
    call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::internal::assign_op<double,double>>
              (m,&local_28,(assign_op<double,_double> *)&local_29);
    free(local_28.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data)
    ;
  }
  return;
}

Assistant:

static void run(MatrixType& m) {
    if (m.rows()==m.cols())
      m.matrix().template triangularView<StrictlyUpper>().swap(m.matrix().transpose());
    else
      m = m.transpose().eval();
  }